

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void Shutdown(NodeContext *node)

{
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  reference ppBVar4;
  reference ppCVar5;
  ConstevalFormatString<1U> fmt;
  pointer pCVar6;
  long in_RDI;
  long in_FS_OFFSET;
  unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_> *client_1;
  vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
  *__range1_2;
  Chainstate *chainstate_1;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range2_1;
  BaseIndex *index;
  vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *__range1_1;
  Chainstate *chainstate;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range2;
  unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_> *client;
  vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
  *__range1;
  iterator __end1_2;
  iterator __begin1_2;
  iterator __end2_1;
  iterator __begin2_1;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end2;
  iterator __begin2;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock_shutdown;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffd6c;
  char *this;
  CTxMemPool *this_00;
  char *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  ArgsManager *in_stack_fffffffffffffd90;
  ArgsManager *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  ArgsManager *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  ChainstateManager *in_stack_fffffffffffffdb8;
  Chainstate *in_stack_fffffffffffffdc0;
  type in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffddc;
  ConstevalFormatString<1U> in_stack_fffffffffffffe18;
  Chainstate *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  BaseIndex *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  char local_140 [24];
  BaseIndex **local_128;
  BaseIndex **local_120;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 skip_file_commit;
  FopenFn *in_stack_fffffffffffffef0;
  path *in_stack_fffffffffffffef8;
  CTxMemPool *in_stack_ffffffffffffff00;
  Level in_stack_ffffffffffffff10;
  char (*in_stack_ffffffffffffff20) [9];
  allocator<char> local_a1 [153];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((Shutdown(node::NodeContext&)::g_shutdown_mutex == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Shutdown(node::NodeContext&)::g_shutdown_mutex), iVar2 != 0)) {
    __cxa_atexit(AnnotatedMixin<std::mutex>::~AnnotatedMixin,&Shutdown::g_shutdown_mutex,
                 &__dso_handle);
    __cxa_guard_release(&Shutdown(node::NodeContext&)::g_shutdown_mutex);
  }
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffda8,
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd8c,SUB41((uint)in_stack_fffffffffffffd88 >> 0x18,0));
  bVar1 = UniqueLock::operator_cast_to_bool
                    ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                     CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    this_00 = (CTxMemPool *)0x1d18c7d;
    this = "%s: In progress...\n";
    uVar7 = 2;
    logging_function._M_str = in_stack_fffffffffffffe38;
    logging_function._M_len = (size_t)in_stack_fffffffffffffe30;
    source_file._M_str = in_stack_fffffffffffffe28;
    source_file._M_len = (size_t)in_stack_fffffffffffffe20;
    LogPrintFormatInternal<char[9]>
              (logging_function,source_file,in_stack_fffffffffffffddc,
               (LogFlags)in_stack_fffffffffffffdd0,in_stack_ffffffffffffff10,
               in_stack_fffffffffffffe18,in_stack_ffffffffffffff20);
    inline_assertion_check<true,ArgsManager*&>
              ((ArgsManager **)in_stack_fffffffffffffda8,
               (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),(char *)in_stack_fffffffffffffd90,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdb8,
               (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
               (allocator<char> *)in_stack_fffffffffffffda8);
    util::ThreadRename((string *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    std::allocator<char>::~allocator(local_a1);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
                ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      CTxMemPool::AddTransactionsUpdated((CTxMemPool *)CONCAT44(in_stack_fffffffffffffd6c,uVar7),0);
    }
    StopHTTPRPC();
    StopREST();
    std::any::
    any<node::NodeContext*,node::NodeContext*,std::any::_Manager_internal<node::NodeContext*>,void>
              ((any *)this_00,(NodeContext **)this);
    StopRPC((any *)0xf9f87b);
    std::any::~any((any *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    StopHTTPServer();
    std::
    vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
    ::begin((vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
             *)this);
    std::
    vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
    ::end((vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
           *)this);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                        ((__normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                          *)this_00,
                         (__normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                          *)this);
      skip_file_commit = (undefined1)((ulong)in_stack_fffffffffffffee8 >> 0x38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
      ::operator*((__normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      pCVar6 = std::
               unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>::
               operator->((unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
                           *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      (*pCVar6->_vptr_ChainClient[6])();
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
      ::operator++((__normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    }
    StopMapPort();
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if ((bVar1) &&
       (bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *
                           )CONCAT44(in_stack_fffffffffffffd6c,uVar7)), bVar1)) {
      std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
                ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::get
                ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      ValidationSignals::UnregisterValidationInterface
                ((ValidationSignals *)CONCAT44(in_stack_fffffffffffffd6c,uVar7),
                 (CValidationInterface *)0xf9f9c8);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::operator->
                ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      CConnman::Stop((CConnman *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    }
    StopTorControl();
    bVar1 = std::thread::joinable((thread *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::thread::join();
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::unique_ptr<CScheduler,_std::default_delete<CScheduler>_>::operator->
                ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      CScheduler::stop((CScheduler *)this);
    }
    std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::reset
              ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xf9fa88);
    std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::reset
              ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xf9fa9d);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::reset
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xf9fab2);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::reset
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xf9fac7);
    std::unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>::reset
              ((unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xf9fadc);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
                ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      bVar1 = CTxMemPool::GetLoadTried(this_00);
      in_stack_fffffffffffffddc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffddc);
      if (bVar1) {
        bVar1 = ::node::ShouldPersistMempool(in_stack_fffffffffffffd90);
        in_stack_fffffffffffffddc =
             CONCAT13((char)((uint)in_stack_fffffffffffffddc >> 0x18),
                      CONCAT12(bVar1,(short)in_stack_fffffffffffffddc));
        if (bVar1) {
          in_stack_fffffffffffffdd0 =
               std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
                         ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_00);
          ::node::MempoolPath(in_stack_fffffffffffffd98);
          std::function<_IO_FILE*(fs::path_const&,char_const*)>::
          function<_IO_FILE*(&)(fs::path_const&,char_const*),void>
                    ((function<_IO_FILE_*(const_fs::path_&,_const_char_*)> *)this_00,
                     (_func__IO_FILE_ptr_path_ptr_char_ptr *)this);
          ::node::DumpMempool(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                              in_stack_fffffffffffffef0,(bool)skip_file_commit);
          std::function<_IO_FILE_*(const_fs::path_&,_const_char_*)>::~function
                    ((function<_IO_FILE_*(const_fs::path_&,_const_char_*)> *)
                     CONCAT44(in_stack_fffffffffffffd6c,uVar7));
          fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
        }
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
                        *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>::
      operator->((unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      CBlockPolicyEstimator::Flush
                ((CBlockPolicyEstimator *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                         CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      if (bVar1) {
        in_stack_fffffffffffffdc0 =
             (Chainstate *)
             std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
                       ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                        CONCAT44(in_stack_fffffffffffffd6c,uVar7));
        std::unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>::get
                  ((unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> *
                   )CONCAT44(in_stack_fffffffffffffd6c,uVar7));
        ValidationSignals::UnregisterValidationInterface
                  ((ValidationSignals *)CONCAT44(in_stack_fffffffffffffd6c,uVar7),
                   (CValidationInterface *)0xf9fc83);
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      in_stack_fffffffffffffdb8 =
           (ChainstateManager *)
           MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                     ((AnnotatedMixin<std::recursive_mutex> *)
                      CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffda8,
                 (AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                 (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd8c,SUB41((uint)in_stack_fffffffffffffd88 >> 0x18,0));
      std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
                ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      ChainstateManager::GetAll(in_stack_fffffffffffffdb8);
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)this);
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)this);
      while (bVar1 = __gnu_cxx::
                     operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                               ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                 *)this_00,
                                (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                 *)this), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
        ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
        bVar1 = Chainstate::CanFlushToDisk((Chainstate *)this_00);
        if (bVar1) {
          Chainstate::ForceFlushStateToDisk(in_stack_fffffffffffffdc0);
        }
        __gnu_cxx::
        __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
        ::operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      }
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)this_00);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
                ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      ValidationSignals::FlushBackgroundCallbacks
                ((ValidationSignals *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    }
    pcVar3 = (char *)(in_RDI + 0x68);
    local_120 = (BaseIndex **)
                std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::begin
                          ((vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *)this);
    local_128 = (BaseIndex **)
                std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::end
                          ((vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *)this);
    while (bVar1 = __gnu_cxx::
                   operator==<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                             ((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                               *)this_00,
                              (__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                               *)this), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppBVar4 = __gnu_cxx::
                __normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                ::operator*((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      in_stack_fffffffffffffe30 = *ppBVar4;
      BaseIndex::Stop((BaseIndex *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      __gnu_cxx::
      __normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>::
      operator++((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<TxIndex,_std::default_delete<TxIndex>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::unique_ptr<TxIndex,_std::default_delete<TxIndex>_>::reset
                ((unique_ptr<TxIndex,_std::default_delete<TxIndex>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xf9ff24);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::unique_ptr<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>::reset
                ((unique_ptr<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xf9ff46);
    }
    DestroyAllBlockFilterIndexes();
    std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::clear
              ((vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      in_stack_fffffffffffffda8 =
           (ArgsManager *)
           MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                     ((AnnotatedMixin<std::recursive_mutex> *)
                      CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffda8,
                 (AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                 (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd8c,SUB41((uint)in_stack_fffffffffffffd88 >> 0x18,0));
      std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
                ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      ChainstateManager::GetAll(in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffe28 = local_140;
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)this);
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)this);
      while (bVar1 = __gnu_cxx::
                     operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                               ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                 *)this_00,
                                (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                 *)this), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                  ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
        in_stack_fffffffffffffe20 = *ppCVar5;
        bVar1 = Chainstate::CanFlushToDisk((Chainstate *)this_00);
        if (bVar1) {
          Chainstate::ForceFlushStateToDisk(in_stack_fffffffffffffdc0);
          Chainstate::ResetCoinsViews((Chainstate *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
        }
        __gnu_cxx::
        __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
        ::operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      }
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)this_00);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    }
    fmt.fmt = (char *)(in_RDI + 0x88);
    std::
    vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
    ::begin((vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
             *)this);
    std::
    vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
    ::end((vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
           *)this);
    while (bVar1 = __gnu_cxx::
                   operator==<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                             ((__normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                               *)this_00,
                              (__normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                               *)this), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
      ::operator*((__normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      pCVar6 = std::
               unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>::
               operator->((unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
                           *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      (*pCVar6->_vptr_ChainClient[7])();
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
      ::operator++((__normal_iterator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_*,_std::vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    }
    std::
    vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
    ::clear((vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    if (bVar1) {
      std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
                ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,uVar7));
      ValidationSignals::UnregisterAllValidationInterfaces
                ((ValidationSignals *)CONCAT44(in_stack_fffffffffffffd6c,uVar7));
    }
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::reset
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xfa021f);
    std::unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>::reset
              ((unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xfa0235);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::reset
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xfa024b);
    std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::reset
              ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xfa0264);
    std::unique_ptr<CScheduler,_std::default_delete<CScheduler>_>::reset
              ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xfa027d);
    std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::reset
              ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xfa0293);
    std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::reset
              ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar7),(pointer)0xfa02a5);
    RemovePidFile(in_stack_fffffffffffffda8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    in_stack_fffffffffffffd68 = 2;
    logging_function_00._M_str = pcVar3;
    logging_function_00._M_len = (size_t)in_stack_fffffffffffffe30;
    source_file_00._M_str = in_stack_fffffffffffffe28;
    source_file_00._M_len = (size_t)in_stack_fffffffffffffe20;
    LogPrintFormatInternal<char[9]>
              (logging_function_00,source_file_00,in_stack_fffffffffffffddc,
               (LogFlags)in_stack_fffffffffffffdd0,in_stack_ffffffffffffff10,fmt,
               in_stack_ffffffffffffff20);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Shutdown(NodeContext& node)
{
    static Mutex g_shutdown_mutex;
    TRY_LOCK(g_shutdown_mutex, lock_shutdown);
    if (!lock_shutdown) return;
    LogPrintf("%s: In progress...\n", __func__);
    Assert(node.args);

    /// Note: Shutdown() must be able to handle cases in which initialization failed part of the way,
    /// for example if the data directory was found to be locked.
    /// Be sure that anything that writes files or flushes caches only does this if the respective
    /// module was initialized.
    util::ThreadRename("shutoff");
    if (node.mempool) node.mempool->AddTransactionsUpdated(1);

    StopHTTPRPC();
    StopREST();
    StopRPC(&node);
    StopHTTPServer();
    for (const auto& client : node.chain_clients) {
        client->flush();
    }
    StopMapPort();

    // Because these depend on each-other, we make sure that neither can be
    // using the other before destroying them.
    if (node.peerman && node.validation_signals) node.validation_signals->UnregisterValidationInterface(node.peerman.get());
    if (node.connman) node.connman->Stop();

    StopTorControl();

    if (node.background_init_thread.joinable()) node.background_init_thread.join();
    // After everything has been shut down, but before things get flushed, stop the
    // the scheduler. After this point, SyncWithValidationInterfaceQueue() should not be called anymore
    // as this would prevent the shutdown from completing.
    if (node.scheduler) node.scheduler->stop();

    // After the threads that potentially access these pointers have been stopped,
    // destruct and reset all to nullptr.
    node.peerman.reset();
    node.connman.reset();
    node.banman.reset();
    node.addrman.reset();
    node.netgroupman.reset();

    if (node.mempool && node.mempool->GetLoadTried() && ShouldPersistMempool(*node.args)) {
        DumpMempool(*node.mempool, MempoolPath(*node.args));
    }

    // Drop transactions we were still watching, record fee estimations and unregister
    // fee estimator from validation interface.
    if (node.fee_estimator) {
        node.fee_estimator->Flush();
        if (node.validation_signals) {
            node.validation_signals->UnregisterValidationInterface(node.fee_estimator.get());
        }
    }

    // FlushStateToDisk generates a ChainStateFlushed callback, which we should avoid missing
    if (node.chainman) {
        LOCK(cs_main);
        for (Chainstate* chainstate : node.chainman->GetAll()) {
            if (chainstate->CanFlushToDisk()) {
                chainstate->ForceFlushStateToDisk();
            }
        }
    }

    // After there are no more peers/RPC left to give us new data which may generate
    // CValidationInterface callbacks, flush them...
    if (node.validation_signals) node.validation_signals->FlushBackgroundCallbacks();

    // Stop and delete all indexes only after flushing background callbacks.
    for (auto* index : node.indexes) index->Stop();
    if (g_txindex) g_txindex.reset();
    if (g_coin_stats_index) g_coin_stats_index.reset();
    DestroyAllBlockFilterIndexes();
    node.indexes.clear(); // all instances are nullptr now

    // Any future callbacks will be dropped. This should absolutely be safe - if
    // missing a callback results in an unrecoverable situation, unclean shutdown
    // would too. The only reason to do the above flushes is to let the wallet catch
    // up with our current chain to avoid any strange pruning edge cases and make
    // next startup faster by avoiding rescan.

    if (node.chainman) {
        LOCK(cs_main);
        for (Chainstate* chainstate : node.chainman->GetAll()) {
            if (chainstate->CanFlushToDisk()) {
                chainstate->ForceFlushStateToDisk();
                chainstate->ResetCoinsViews();
            }
        }
    }
    for (const auto& client : node.chain_clients) {
        client->stop();
    }

#ifdef ENABLE_ZMQ
    if (g_zmq_notification_interface) {
        if (node.validation_signals) node.validation_signals->UnregisterValidationInterface(g_zmq_notification_interface.get());
        g_zmq_notification_interface.reset();
    }
#endif

    node.chain_clients.clear();
    if (node.validation_signals) {
        node.validation_signals->UnregisterAllValidationInterfaces();
    }
    node.mempool.reset();
    node.fee_estimator.reset();
    node.chainman.reset();
    node.validation_signals.reset();
    node.scheduler.reset();
    node.ecc_context.reset();
    node.kernel.reset();

    RemovePidFile(*node.args);

    LogPrintf("%s: done\n", __func__);
}